

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O0

void __thiscall amrex::MLABecLaplacian::applyRobinBCTermsCoeffs(MLABecLaplacian *this)

{
  double dVar1;
  __uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true> _Var2;
  bool bVar3;
  int iVar4;
  Geometry *pGVar5;
  IntVect *pIVar6;
  reference pvVar7;
  long lVar8;
  MFItInfo *in_RDI;
  Real B_5;
  int i_5;
  int j_5;
  int k_5;
  Dim3 amrex_i_hi_5;
  Dim3 amrex_i_lo_5;
  Real fac_5;
  Real B_4;
  int i_4;
  int j_4;
  int k_4;
  Dim3 amrex_i_hi_4;
  Dim3 amrex_i_lo_4;
  Real fac_4;
  Real B_3;
  int i_3;
  int j_3;
  int k_3;
  Dim3 amrex_i_hi_3;
  Dim3 amrex_i_lo_3;
  Real fac_3;
  Real B_2;
  int i_2;
  int j_2;
  int k_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  Real fac_2;
  Real B_1;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Real fac_1;
  Real B;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Real fac;
  Array4<const_double> *rbc;
  int icomp;
  bool outside_domain_hi;
  bool outside_domain_lo;
  Box *bhi;
  Box *blo;
  Array4<const_double> *bfab;
  int idim;
  Array4<double> *afab;
  Box *vbx;
  MFIter mfi;
  MFItInfo mfi_info;
  Real dzi;
  Real dyi;
  Real dxi;
  Box *domain;
  int mglev;
  int amrlev;
  Real bovera;
  bool reset_alpha;
  int ncomp;
  IndexType typ;
  int sm;
  IntVect hi;
  IntVect low;
  IndexType typ_1;
  int bg;
  uint bitval;
  IntVect hi_1;
  IntVect low_1;
  MFIter *in_stack_fffffffffffff178;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff180;
  MLLinOp *in_stack_fffffffffffff188;
  MFIter *in_stack_fffffffffffff190;
  Box *this_00;
  FabArrayBase *in_stack_fffffffffffff1a8;
  undefined4 in_stack_fffffffffffff1b0;
  int in_stack_fffffffffffff1b4;
  int local_e48;
  int local_e44;
  int local_dec;
  int local_de8;
  int local_de4;
  int local_d8c;
  int local_d88;
  int local_d84;
  int local_d2c;
  int local_d28;
  int local_d24;
  int local_ccc;
  int local_cc8;
  int local_cc4;
  int local_c6c;
  int local_c68;
  int local_c64;
  Array4<const_double> local_c08;
  Array4<const_double> *local_bc8;
  int local_bbc;
  byte local_bb6;
  byte local_bb5;
  Box local_bb4;
  Box *local_b98;
  Box local_b8c;
  Box *local_b70;
  undefined1 local_b68 [184];
  Box *local_ab0;
  MFIter local_aa8;
  MFItInfo local_a44;
  pointer local_a30;
  pointer local_a28;
  pointer local_a20;
  Box *local_a18;
  undefined4 local_a10;
  int local_a0c;
  double local_a08;
  byte local_9fd;
  int local_9fc;
  uint local_9ec;
  uint local_9e8;
  int local_9e4;
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [36];
  uint local_9ac;
  uint local_9a8;
  int local_9a4;
  int local_9a0 [3];
  Vector<int,_std::allocator<int>_> *local_990;
  int local_988;
  uint local_984;
  IntVect local_980;
  IntVect local_970;
  int local_960 [2];
  Box *local_958;
  Array4<const_double> local_950;
  int local_90c;
  FArrayBox *local_908;
  pointer local_900;
  int local_8f8;
  Box *local_8f0;
  int local_8e4;
  int iStack_8e0;
  int local_8dc;
  pointer local_8d8;
  int local_8d0;
  Box *local_8c8;
  int local_8bc;
  int iStack_8b8;
  int local_8b4;
  pointer local_8b0;
  int local_8a8;
  Box *local_8a0;
  int local_894;
  int iStack_890;
  int local_88c;
  pointer local_888;
  int local_880;
  Box *local_878;
  int local_86c;
  int iStack_868;
  int local_864;
  pointer local_860;
  int local_858;
  Box *local_850;
  int local_844;
  int iStack_840;
  int local_83c;
  double local_838;
  int local_830;
  Box *local_828;
  int local_81c;
  int iStack_818;
  int local_814;
  Real local_810;
  int local_808;
  Box *local_800;
  int local_7f4;
  int iStack_7f0;
  int local_7ec;
  undefined8 local_7e8;
  int local_7e0;
  Box *local_7d8;
  int local_7cc;
  int iStack_7c8;
  int local_7c4;
  undefined8 local_7c0;
  int local_7b8;
  Box *local_7b0;
  int local_7a4;
  int iStack_7a0;
  int local_79c;
  undefined8 local_798;
  int local_790;
  Box *local_788;
  int local_77c;
  int iStack_778;
  int local_774;
  undefined8 local_770;
  int local_768;
  Box *local_760;
  int local_754;
  int iStack_750;
  int local_74c;
  undefined8 local_748;
  int local_740;
  Box *local_738;
  int local_72c;
  int iStack_728;
  int local_724;
  int local_720;
  int local_71c;
  int local_718;
  int local_714;
  FabArray<amrex::FArrayBox> *local_710;
  undefined4 local_708;
  int local_704;
  int local_700;
  int local_6fc;
  Array4<const_double> *local_6f8;
  undefined4 local_6f0;
  int local_6ec;
  int local_6e8;
  int local_6e4;
  Array4<const_double> *local_6e0;
  undefined4 local_6d8;
  int local_6d4;
  int local_6d0;
  int local_6cc;
  Array4<const_double> *local_6c8;
  undefined4 local_6c0;
  int local_6bc;
  int local_6b8;
  int local_6b4;
  Array4<const_double> *local_6b0;
  int local_6a8;
  int local_6a4;
  int local_6a0;
  int local_69c;
  FabArray<amrex::FArrayBox> *local_698;
  undefined4 local_690;
  int local_68c;
  int local_688;
  int local_684;
  Array4<const_double> *local_680;
  undefined4 local_678;
  int local_674;
  int local_670;
  int local_66c;
  Array4<const_double> *local_668;
  undefined4 local_660;
  int local_65c;
  int local_658;
  int local_654;
  Array4<const_double> *local_650;
  undefined4 local_648;
  int local_644;
  int local_640;
  int local_63c;
  Array4<const_double> *local_638;
  int local_630;
  int local_62c;
  int local_628;
  int local_624;
  FabArray<amrex::FArrayBox> *local_620;
  undefined4 local_618;
  int local_614;
  int local_610;
  int local_60c;
  Array4<const_double> *local_608;
  undefined4 local_600;
  int local_5fc;
  int local_5f8;
  int local_5f4;
  Array4<const_double> *local_5f0;
  undefined4 local_5e8;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  Array4<const_double> *local_5d8;
  undefined4 local_5d0;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  Array4<const_double> *local_5c0;
  int local_5b8;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  FabArray<amrex::FArrayBox> *local_5a8;
  undefined4 local_5a0;
  int local_59c;
  int local_598;
  int local_594;
  Array4<const_double> *local_590;
  undefined4 local_588;
  int local_584;
  int local_580;
  int local_57c;
  Array4<const_double> *local_578;
  undefined4 local_570;
  int local_56c;
  int local_568;
  int local_564;
  Array4<const_double> *local_560;
  undefined4 local_558;
  int local_554;
  int local_550;
  int local_54c;
  Array4<const_double> *local_548;
  int local_540;
  int local_53c;
  int local_538;
  int local_534;
  FabArray<amrex::FArrayBox> *local_530;
  undefined4 local_528;
  int local_524;
  int local_520;
  int local_51c;
  Array4<const_double> *local_518;
  undefined4 local_510;
  int local_50c;
  int local_508;
  int local_504;
  Array4<const_double> *local_500;
  undefined4 local_4f8;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  Array4<const_double> *local_4e8;
  undefined4 local_4e0;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  Array4<const_double> *local_4d0;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  FabArray<amrex::FArrayBox> *local_4b8;
  undefined4 local_4b0;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  Array4<const_double> *local_4a0;
  undefined4 local_498;
  int local_494;
  int local_490;
  int local_48c;
  Array4<const_double> *local_488;
  undefined4 local_480;
  int local_47c;
  int local_478;
  int local_474;
  Array4<const_double> *local_470;
  undefined4 local_468;
  int local_464;
  int local_460;
  int local_45c;
  Array4<const_double> *local_458;
  int local_450;
  int local_44c;
  int local_448;
  int local_444;
  long *local_440;
  int local_438;
  int local_434;
  int local_430;
  int local_42c;
  long *local_428;
  int local_420;
  int local_41c;
  int local_418;
  int local_414;
  long *local_410;
  int local_408;
  int local_404;
  int local_400;
  int local_3fc;
  long *local_3f8;
  int local_3f0;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  long *local_3e0;
  int local_3d8;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  long *local_3c8;
  uint local_3bc;
  uint *local_3b8;
  uint local_3b0;
  uint local_3ac;
  uint *local_3a8;
  uint local_3a0;
  uint local_39c;
  IntVect *local_398;
  uint local_38c;
  Vector<int,_std::allocator<int>_> **local_388;
  uint local_37c;
  MLLinOp *local_378;
  undefined4 local_36c;
  IntVect *local_368;
  undefined4 local_35c;
  IntVect *local_358;
  undefined4 local_34c;
  IntVect *local_348;
  undefined4 local_33c;
  IntVect *local_338;
  undefined4 local_32c;
  IntVect *local_328;
  undefined4 local_31c;
  IntVect *local_318;
  undefined4 local_30c;
  IntVect *local_308;
  undefined4 local_2fc;
  IntVect *local_2f8;
  undefined4 local_2ec;
  IntVect *local_2e8;
  undefined4 local_2dc;
  IntVect *local_2d8;
  undefined4 local_2cc;
  IntVect *local_2c8;
  undefined4 local_2bc;
  IntVect *local_2b8;
  undefined4 local_2ac;
  IntVect *local_2a8;
  undefined4 local_29c;
  IntVect *local_298;
  undefined4 local_28c;
  IntVect *local_288;
  undefined4 local_27c;
  IntVect *local_278;
  undefined4 local_26c;
  IntVect *local_268;
  undefined4 local_25c;
  IntVect *local_258;
  undefined4 local_24c;
  Box *local_248;
  undefined4 local_23c;
  Box *local_238;
  undefined4 local_22c;
  Box *local_228;
  undefined4 local_21c;
  Box *local_218;
  undefined4 local_20c;
  Box *local_208;
  undefined4 local_1fc;
  Box *local_1f8;
  undefined4 local_1ec;
  Box *local_1e8;
  undefined4 local_1dc;
  Box *local_1d8;
  undefined4 local_1cc;
  Box *local_1c8;
  undefined4 local_1bc;
  Box *local_1b8;
  undefined4 local_1ac;
  Box *local_1a8;
  undefined4 local_19c;
  Box *local_198;
  undefined4 local_18c;
  Box *local_188;
  undefined4 local_17c;
  Box *local_178;
  undefined4 local_16c;
  Box *local_168;
  undefined4 local_15c;
  Box *local_158;
  undefined4 local_14c;
  Box *local_148;
  undefined4 local_13c;
  Box *local_138;
  int local_130;
  uint local_12c;
  IntVect *local_128;
  int local_120;
  uint local_11c;
  IntVect *local_118;
  int local_110;
  uint local_10c;
  MFIter *local_108;
  int local_100;
  uint local_fc;
  MLLinOp *local_f8;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  double *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  bVar3 = MLLinOp::hasRobinBC(in_stack_fffffffffffff188);
  if (bVar3) {
    local_9fc = (**(code **)(*(long *)in_RDI + 0x28))();
    local_9fd = 0;
    dVar1 = *(double *)in_RDI[0x28].tilesize.vect;
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      in_RDI[0x28].tilesize.vect[0] = 0;
      in_RDI[0x28].tilesize.vect[1] = 0x3ff00000;
      local_9fd = 1;
    }
    local_a08 = *(double *)(in_RDI[0x28].tilesize.vect + 2) / *(double *)in_RDI[0x28].tilesize.vect;
    for (local_a0c = 0; local_a0c < in_RDI[2].tilesize.vect[1]; local_a0c = local_a0c + 1) {
      local_a10 = 0;
      Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    *)in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
      pGVar5 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                         ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                          in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
      local_a18 = Geometry::Domain(pGVar5);
      Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    *)in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
      pGVar5 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                         ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                          in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
      local_a20 = (pointer)CoordSys::InvCellSize(&pGVar5->super_CoordSys,0);
      Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    *)in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
      pGVar5 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                         ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                          in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
      local_a28 = (pointer)CoordSys::InvCellSize(&pGVar5->super_CoordSys,1);
      Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    *)in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
      pGVar5 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                         ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                          in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
      local_a30 = (pointer)CoordSys::InvCellSize(&pGVar5->super_CoordSys,2);
      if ((local_9fd & 1) != 0) {
        Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                      *)in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
        Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                  ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                   in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
        FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff180,(value_type)in_stack_fffffffffffff178);
      }
      MFItInfo::MFItInfo((MFItInfo *)in_stack_fffffffffffff190);
      MFItInfo::SetDynamic(&local_a44,true);
      Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                    *)in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
      Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
      MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffff1b4,in_stack_fffffffffffff1b0),
                     in_stack_fffffffffffff1a8,in_RDI);
      while (bVar3 = MFIter::isValid(&local_aa8), bVar3) {
        MFIter::validbox(in_stack_fffffffffffff190);
        local_ab0 = (Box *)(local_b68 + 0x9c);
        Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                      *)in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
        Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                  ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                   in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff188,
                   (MFIter *)in_stack_fffffffffffff180);
        local_b68._144_8_ = local_b68 + 0x50;
        for (local_b68._76_4_ = 0; (int)local_b68._76_4_ < 3;
            local_b68._76_4_ = local_b68._76_4_ + 1) {
          Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
          ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                        *)in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
          Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
          ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                        *)in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
          std::array<amrex::MultiFab,_3UL>::operator[]
                    ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff180,
                     (size_type)in_stack_fffffffffffff178);
          in_stack_fffffffffffff180 = (FabArray<amrex::FArrayBox> *)local_b68;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff188,
                     (MFIter *)in_stack_fffffffffffff180);
          local_9d0._24_8_ = local_ab0;
          local_9d0._20_4_ = local_b68._76_4_;
          local_9d0._16_4_ = 1;
          local_b68._64_8_ = in_stack_fffffffffffff180;
          pIVar6 = Box::smallEnd(local_ab0);
          local_9d0._8_4_ = pIVar6->vect[2];
          local_9d0._0_8_ = *(undefined8 *)pIVar6->vect;
          pIVar6 = Box::bigEnd((Box *)local_9d0._24_8_);
          iVar4 = pIVar6->vect[2];
          _Var2.
          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t
          .super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               *(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)
                pIVar6->vect;
          in_stack_fffffffffffff188 = (MLLinOp *)local_9d0;
          local_37c = local_9d0._20_4_;
          local_9e4 = (in_stack_fffffffffffff188->m_ixtype).vect
                      [(long)(int)local_9d0._20_4_ + -0x1c];
          local_fc = local_9d0._20_4_;
          (in_stack_fffffffffffff188->m_ixtype).vect[(long)(int)local_9d0._20_4_ + -0x1c] =
               local_9e4 - local_9d0._16_4_;
          in_stack_fffffffffffff190 = (MFIter *)local_9e0;
          local_10c = local_9d0._20_4_;
          (in_stack_fffffffffffff190->tile_size).vect[(long)(int)local_9d0._20_4_ + -4] =
               local_9e4 + -1;
          local_9e0._0_8_ =
               _Var2.
               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
          local_9e0._8_4_ = iVar4;
          local_378 = in_stack_fffffffffffff188;
          local_110 = local_9e4 + -1;
          local_108 = in_stack_fffffffffffff190;
          local_100 = local_9e4 - local_9d0._16_4_;
          local_f8 = in_stack_fffffffffffff188;
          local_9ec = (uint)Box::ixType((Box *)local_9d0._24_8_);
          local_3a8 = &local_9e8;
          local_3ac = local_9d0._20_4_;
          local_3a0 = local_9d0._20_4_;
          local_9ec = local_9ec & ~(1 << (local_9d0._20_4_ & 0x1f));
          this_00 = &local_b8c;
          local_9e8 = local_9ec;
          Box::Box(this_00,(IntVect *)in_stack_fffffffffffff188,(IntVect *)in_stack_fffffffffffff190
                   ,(IndexType)local_9ec);
          local_958 = local_ab0;
          local_960[1] = local_b68._76_4_;
          local_960[0] = 1;
          local_b70 = this_00;
          pIVar6 = Box::smallEnd(local_ab0);
          local_970.vect[2] = pIVar6->vect[2];
          local_970.vect._0_8_ = *(undefined8 *)pIVar6->vect;
          pIVar6 = Box::bigEnd(local_958);
          local_980.vect[2] = pIVar6->vect[2];
          local_980.vect._0_8_ = *(undefined8 *)pIVar6->vect;
          local_9a0 = (int  [3])Box::type(this_00);
          local_990 = (Vector<int,_std::allocator<int>_> *)local_9a0._0_8_;
          local_988 = local_9a0[2];
          local_38c = local_960[1];
          local_984 = *(uint *)((long)&local_990 + (long)local_960[1] * 4);
          local_39c = local_960[1];
          local_9a4 = (local_980.vect[local_960[1]] + 1) - (local_984 & 1);
          local_11c = local_960[1];
          local_970.vect[local_960[1]] = local_9a4;
          iVar4 = local_9a4 + local_960[0] + -1;
          local_12c = local_960[1];
          local_980.vect[local_960[1]] = iVar4;
          local_398 = &local_980;
          local_388 = &local_990;
          local_130 = iVar4;
          local_128 = &local_980;
          local_120 = local_9a4;
          local_118 = &local_970;
          local_9ac = (uint)Box::ixType(local_958);
          local_3b8 = &local_9a8;
          local_3bc = local_960[1];
          local_3b0 = local_960[1];
          local_9ac = (1 << ((byte)local_960[1] & 0x1f) ^ 0xffffffffU) & local_9ac;
          local_9a8 = local_9ac;
          Box::Box(&local_bb4,&local_970,&local_980,(IndexType)local_9ac);
          local_b98 = &local_bb4;
          bVar3 = Box::contains(local_a18,local_b70);
          local_bb5 = (bVar3 ^ 0xffU) & 1;
          bVar3 = Box::contains(local_a18,local_b98);
          local_bb6 = (bVar3 ^ 0xffU) & 1;
          if (((local_bb5 & 1) != 0) || (local_bb6 != 0)) {
            for (local_bbc = 0; local_bbc < local_9fc; local_bbc = local_bbc + 1) {
              Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                            *)in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
              in_stack_fffffffffffff178 =
                   (MFIter *)
                   std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::
                   operator*((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                             in_stack_fffffffffffff180);
              local_908 = FabArray<amrex::FArrayBox>::operator[]
                                    (in_stack_fffffffffffff180,in_stack_fffffffffffff178);
              local_90c = local_bbc * 3;
              local_a8 = (local_908->super_BaseFab<double>).dptr;
              local_b0 = &(local_908->super_BaseFab<double>).domain;
              local_b4 = (local_908->super_BaseFab<double>).nvar;
              local_5c = 0;
              local_88 = (local_b0->smallend).vect[0];
              local_6c = 1;
              iStack_84 = (local_908->super_BaseFab<double>).domain.smallend.vect[1];
              local_d0.x = (local_b0->smallend).vect[0];
              local_d0.y = (local_b0->smallend).vect[1];
              local_7c = 2;
              local_d0.z = (local_908->super_BaseFab<double>).domain.smallend.vect[2];
              local_8 = &(local_908->super_BaseFab<double>).domain.bigend;
              local_c = 0;
              local_38 = local_8->vect[0] + 1;
              local_18 = &(local_908->super_BaseFab<double>).domain.bigend;
              local_1c = 1;
              iStack_34 = (local_908->super_BaseFab<double>).domain.bigend.vect[1] + 1;
              local_28 = &(local_908->super_BaseFab<double>).domain.bigend;
              local_2c = 2;
              local_f0.z = (local_908->super_BaseFab<double>).domain.bigend.vect[2] + 1;
              local_f0.y = iStack_34;
              local_f0.x = local_38;
              local_dc._0_8_ = local_f0._0_8_;
              local_dc.z = local_f0.z;
              local_c0._0_8_ = local_d0._0_8_;
              local_c0.z = local_d0.z;
              local_a0._0_8_ = local_d0._0_8_;
              local_a0.z = local_d0.z;
              local_90 = local_b0;
              local_80 = local_d0.z;
              local_78 = local_b0;
              local_68 = local_b0;
              local_58 = local_b0;
              local_50._0_8_ = local_f0._0_8_;
              local_50.z = local_f0.z;
              local_40 = local_b0;
              local_30 = local_f0.z;
              Array4<const_double>::Array4(&local_950,local_a8,&local_c0,&local_dc,local_b4);
              Array4<const_double>::Array4<const_double,_0>(&local_c08,&local_950,local_90c);
              local_bc8 = &local_c08;
              Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            *)in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
              pvVar7 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                                 ((array<amrex::LinOpBCType,_3UL> *)in_stack_fffffffffffff180,
                                  (size_type)in_stack_fffffffffffff178);
              if ((*pvVar7 == Robin) && ((local_bb5 & 1) != 0)) {
                if (local_b68._76_4_ == 0) {
                  local_828 = local_b70;
                  local_228 = local_b70;
                  local_22c = 0;
                  local_81c = (local_b70->smallend).vect[0];
                  local_238 = local_b70;
                  local_23c = 1;
                  iStack_818 = (local_b70->smallend).vect[1];
                  local_838 = *(double *)(local_b70->smallend).vect;
                  local_248 = local_b70;
                  local_24c = 2;
                  local_830 = (local_b70->smallend).vect[2];
                  local_738 = local_b70;
                  local_348 = &local_b70->bigend;
                  local_34c = 0;
                  local_72c = local_348->vect[0];
                  local_358 = &local_b70->bigend;
                  local_35c = 1;
                  iStack_728 = (local_b70->bigend).vect[1];
                  local_748 = *(undefined8 *)local_348->vect;
                  local_368 = &local_b70->bigend;
                  local_36c = 2;
                  local_740 = (local_b70->bigend).vect[2];
                  for (local_c64 = local_830; local_c68 = iStack_818, local_814 = local_830,
                      local_724 = local_740, local_c64 <= local_740; local_c64 = local_c64 + 1) {
                    for (; local_c6c = local_81c, local_c68 <= iStack_728; local_c68 = local_c68 + 1
                        ) {
                      for (; local_c6c <= local_72c; local_c6c = local_c6c + 1) {
                        local_458 = local_bc8;
                        local_45c = local_c6c;
                        local_460 = local_c68;
                        local_464 = local_c64;
                        local_468 = 1;
                        local_470 = local_bc8;
                        local_474 = local_c6c;
                        local_478 = local_c68;
                        local_47c = local_c64;
                        local_480 = 0;
                        local_488 = local_bc8;
                        local_48c = local_c6c;
                        local_490 = local_c68;
                        local_494 = local_c64;
                        local_498 = 1;
                        local_4a0 = local_bc8;
                        local_4a4 = local_c6c;
                        local_4a8 = local_c68;
                        local_4ac = local_c64;
                        local_4b0 = 0;
                        local_4b8 = (FabArray<amrex::FArrayBox> *)local_b68._64_8_;
                        local_4bc = local_c6c + 1;
                        local_4c0 = local_c68;
                        local_4c4 = local_c64;
                        local_4c8 = local_bbc;
                        local_3c8 = (long *)local_b68._144_8_;
                        local_3cc = local_c6c + 1;
                        local_3d0 = local_c68;
                        local_3d4 = local_c64;
                        local_3d8 = local_bbc;
                        lVar8 = (long)(local_3cc - (int)*(long *)(local_b68._144_8_ + 0x20)) +
                                (long)(local_c68 - *(int *)(local_b68._144_8_ + 0x24)) *
                                *(long *)(local_b68._144_8_ + 8) +
                                (long)(local_c64 - (int)*(long *)(local_b68._144_8_ + 0x28)) *
                                *(long *)(local_b68._144_8_ + 0x10) +
                                (long)local_bbc * *(long *)(local_b68._144_8_ + 0x18);
                        *(double *)(*(long *)local_b68._144_8_ + lVar8 * 8) =
                             local_a08 * (double)local_a20 * (double)local_a20 *
                             *(double *)
                              (*(long *)local_b68._64_8_ +
                              ((long)(local_4bc - *(int *)(local_b68._64_8_ + 0x20)) +
                               (long)(local_c68 - *(int *)(local_b68._64_8_ + 0x24)) *
                               (long)*(FabArrayBase **)&((BoxArray *)(local_b68._64_8_ + 8))->m_bat
                               + (long)(local_c64 - *(int *)(local_b68._64_8_ + 0x28)) *
                                 *(long *)((IntVect *)(local_b68._64_8_ + 0x10))->vect +
                              (long)local_bbc * *(long *)(local_b68._64_8_ + 0x18)) * 8) *
                             (1.0 - (local_bc8->p
                                     [(long)(local_c6c - (local_bc8->begin).x) +
                                      (long)(local_c68 - (local_bc8->begin).y) * local_bc8->jstride
                                      + (long)(local_c64 - (local_bc8->begin).z) *
                                        local_bc8->kstride + local_bc8->nstride] * (double)local_a20
                                    + -(local_bc8->p
                                        [(long)(local_c6c - (local_bc8->begin).x) +
                                         (long)(local_c68 - (local_bc8->begin).y) *
                                         local_bc8->jstride +
                                         (long)(local_c64 - (local_bc8->begin).z) *
                                         local_bc8->kstride] * 0.5)) /
                                    (local_bc8->p
                                     [(long)(local_c6c - (local_bc8->begin).x) +
                                      (long)(local_c68 - (local_bc8->begin).y) * local_bc8->jstride
                                      + (long)(local_c64 - (local_bc8->begin).z) *
                                        local_bc8->kstride + local_bc8->nstride] * (double)local_a20
                                    + local_bc8->p
                                      [(long)(local_c6c - (local_bc8->begin).x) +
                                       (long)(local_c68 - (local_bc8->begin).y) * local_bc8->jstride
                                       + (long)(local_c64 - (local_bc8->begin).z) *
                                         local_bc8->kstride] * 0.5)) +
                             *(double *)(*(long *)local_b68._144_8_ + lVar8 * 8);
                      }
                    }
                  }
                }
                else if (local_b68._76_4_ == 1) {
                  local_850 = local_b70;
                  local_1f8 = local_b70;
                  local_1fc = 0;
                  local_844 = (local_b70->smallend).vect[0];
                  local_208 = local_b70;
                  local_20c = 1;
                  iStack_840 = (local_b70->smallend).vect[1];
                  local_860 = *(pointer *)(local_b70->smallend).vect;
                  local_218 = local_b70;
                  local_21c = 2;
                  local_858 = (local_b70->smallend).vect[2];
                  local_760 = local_b70;
                  local_318 = &local_b70->bigend;
                  local_31c = 0;
                  local_754 = local_318->vect[0];
                  local_328 = &local_b70->bigend;
                  local_32c = 1;
                  iStack_750 = (local_b70->bigend).vect[1];
                  local_770 = *(undefined8 *)local_318->vect;
                  local_338 = &local_b70->bigend;
                  local_33c = 2;
                  local_768 = (local_b70->bigend).vect[2];
                  for (local_cc4 = local_858; local_cc8 = iStack_840, local_83c = local_858,
                      local_74c = local_768, local_cc4 <= local_768; local_cc4 = local_cc4 + 1) {
                    for (; local_ccc = local_844, local_cc8 <= iStack_750; local_cc8 = local_cc8 + 1
                        ) {
                      for (; local_ccc <= local_754; local_ccc = local_ccc + 1) {
                        local_4d0 = local_bc8;
                        local_4d4 = local_ccc;
                        local_4d8 = local_cc8;
                        local_4dc = local_cc4;
                        local_4e0 = 1;
                        local_4e8 = local_bc8;
                        local_4ec = local_ccc;
                        local_4f0 = local_cc8;
                        local_4f4 = local_cc4;
                        local_4f8 = 0;
                        local_500 = local_bc8;
                        local_504 = local_ccc;
                        local_508 = local_cc8;
                        local_50c = local_cc4;
                        local_510 = 1;
                        local_518 = local_bc8;
                        local_51c = local_ccc;
                        local_520 = local_cc8;
                        local_524 = local_cc4;
                        local_528 = 0;
                        local_530 = (FabArray<amrex::FArrayBox> *)local_b68._64_8_;
                        local_534 = local_ccc;
                        local_538 = local_cc8 + 1;
                        local_53c = local_cc4;
                        local_540 = local_bbc;
                        local_3e0 = (long *)local_b68._144_8_;
                        local_3e4 = local_ccc;
                        local_3e8 = local_cc8 + 1;
                        local_3ec = local_cc4;
                        local_3f0 = local_bbc;
                        lVar8 = (long)(local_ccc - (int)*(long *)(local_b68._144_8_ + 0x20)) +
                                (long)(local_3e8 - *(int *)(local_b68._144_8_ + 0x24)) *
                                *(long *)(local_b68._144_8_ + 8) +
                                (long)(local_cc4 - (int)*(long *)(local_b68._144_8_ + 0x28)) *
                                *(long *)(local_b68._144_8_ + 0x10) +
                                (long)local_bbc * *(long *)(local_b68._144_8_ + 0x18);
                        *(double *)(*(long *)local_b68._144_8_ + lVar8 * 8) =
                             local_a08 * (double)local_a28 * (double)local_a28 *
                             *(double *)
                              (*(long *)local_b68._64_8_ +
                              ((long)(local_ccc - *(int *)(local_b68._64_8_ + 0x20)) +
                               (long)(local_538 - *(int *)(local_b68._64_8_ + 0x24)) *
                               (long)*(FabArrayBase **)&((BoxArray *)(local_b68._64_8_ + 8))->m_bat
                               + (long)(local_cc4 - *(int *)(local_b68._64_8_ + 0x28)) *
                                 *(long *)((IntVect *)(local_b68._64_8_ + 0x10))->vect +
                              (long)local_bbc * *(long *)(local_b68._64_8_ + 0x18)) * 8) *
                             (1.0 - (local_bc8->p
                                     [(long)(local_ccc - (local_bc8->begin).x) +
                                      (long)(local_cc8 - (local_bc8->begin).y) * local_bc8->jstride
                                      + (long)(local_cc4 - (local_bc8->begin).z) *
                                        local_bc8->kstride + local_bc8->nstride] * (double)local_a28
                                    + -(local_bc8->p
                                        [(long)(local_ccc - (local_bc8->begin).x) +
                                         (long)(local_cc8 - (local_bc8->begin).y) *
                                         local_bc8->jstride +
                                         (long)(local_cc4 - (local_bc8->begin).z) *
                                         local_bc8->kstride] * 0.5)) /
                                    (local_bc8->p
                                     [(long)(local_ccc - (local_bc8->begin).x) +
                                      (long)(local_cc8 - (local_bc8->begin).y) * local_bc8->jstride
                                      + (long)(local_cc4 - (local_bc8->begin).z) *
                                        local_bc8->kstride + local_bc8->nstride] * (double)local_a28
                                    + local_bc8->p
                                      [(long)(local_ccc - (local_bc8->begin).x) +
                                       (long)(local_cc8 - (local_bc8->begin).y) * local_bc8->jstride
                                       + (long)(local_cc4 - (local_bc8->begin).z) *
                                         local_bc8->kstride] * 0.5)) +
                             *(double *)(*(long *)local_b68._144_8_ + lVar8 * 8);
                      }
                    }
                  }
                }
                else {
                  local_878 = local_b70;
                  local_1c8 = local_b70;
                  local_1cc = 0;
                  local_86c = (local_b70->smallend).vect[0];
                  local_1d8 = local_b70;
                  local_1dc = 1;
                  iStack_868 = (local_b70->smallend).vect[1];
                  local_888 = *(pointer *)(local_b70->smallend).vect;
                  local_1e8 = local_b70;
                  local_1ec = 2;
                  local_880 = (local_b70->smallend).vect[2];
                  local_788 = local_b70;
                  local_2e8 = &local_b70->bigend;
                  local_2ec = 0;
                  local_77c = local_2e8->vect[0];
                  local_2f8 = &local_b70->bigend;
                  local_2fc = 1;
                  iStack_778 = (local_b70->bigend).vect[1];
                  local_798 = *(undefined8 *)local_2e8->vect;
                  local_308 = &local_b70->bigend;
                  local_30c = 2;
                  local_790 = (local_b70->bigend).vect[2];
                  for (local_d24 = local_880; local_d28 = iStack_868, local_864 = local_880,
                      local_774 = local_790, local_d24 <= local_790; local_d24 = local_d24 + 1) {
                    for (; local_d2c = local_86c, local_d28 <= iStack_778; local_d28 = local_d28 + 1
                        ) {
                      for (; local_d2c <= local_77c; local_d2c = local_d2c + 1) {
                        local_548 = local_bc8;
                        local_54c = local_d2c;
                        local_550 = local_d28;
                        local_554 = local_d24;
                        local_558 = 1;
                        local_560 = local_bc8;
                        local_564 = local_d2c;
                        local_568 = local_d28;
                        local_56c = local_d24;
                        local_570 = 0;
                        local_578 = local_bc8;
                        local_57c = local_d2c;
                        local_580 = local_d28;
                        local_584 = local_d24;
                        local_588 = 1;
                        local_590 = local_bc8;
                        local_594 = local_d2c;
                        local_598 = local_d28;
                        local_59c = local_d24;
                        local_5a0 = 0;
                        local_5a8 = (FabArray<amrex::FArrayBox> *)local_b68._64_8_;
                        local_5ac = local_d2c;
                        local_5b0 = local_d28;
                        local_5b4 = local_d24 + 1;
                        local_5b8 = local_bbc;
                        local_3f8 = (long *)local_b68._144_8_;
                        local_3fc = local_d2c;
                        local_400 = local_d28;
                        local_404 = local_d24 + 1;
                        local_408 = local_bbc;
                        lVar8 = (long)(local_d2c - (int)*(long *)(local_b68._144_8_ + 0x20)) +
                                (long)(local_d28 - *(int *)(local_b68._144_8_ + 0x24)) *
                                *(long *)(local_b68._144_8_ + 8) +
                                (long)(local_404 - (int)*(long *)(local_b68._144_8_ + 0x28)) *
                                *(long *)(local_b68._144_8_ + 0x10) +
                                (long)local_bbc * *(long *)(local_b68._144_8_ + 0x18);
                        *(double *)(*(long *)local_b68._144_8_ + lVar8 * 8) =
                             local_a08 * (double)local_a30 * (double)local_a30 *
                             *(double *)
                              (*(long *)local_b68._64_8_ +
                              ((long)(local_d2c - *(int *)(local_b68._64_8_ + 0x20)) +
                               (long)(local_d28 - *(int *)(local_b68._64_8_ + 0x24)) *
                               (long)*(FabArrayBase **)&((BoxArray *)(local_b68._64_8_ + 8))->m_bat
                               + (long)(local_5b4 - *(int *)(local_b68._64_8_ + 0x28)) *
                                 *(long *)((IntVect *)(local_b68._64_8_ + 0x10))->vect +
                              (long)local_bbc * *(long *)(local_b68._64_8_ + 0x18)) * 8) *
                             (1.0 - (local_bc8->p
                                     [(long)(local_d2c - (local_bc8->begin).x) +
                                      (long)(local_d28 - (local_bc8->begin).y) * local_bc8->jstride
                                      + (long)(local_d24 - (local_bc8->begin).z) *
                                        local_bc8->kstride + local_bc8->nstride] * (double)local_a30
                                    + -(local_bc8->p
                                        [(long)(local_d2c - (local_bc8->begin).x) +
                                         (long)(local_d28 - (local_bc8->begin).y) *
                                         local_bc8->jstride +
                                         (long)(local_d24 - (local_bc8->begin).z) *
                                         local_bc8->kstride] * 0.5)) /
                                    (local_bc8->p
                                     [(long)(local_d2c - (local_bc8->begin).x) +
                                      (long)(local_d28 - (local_bc8->begin).y) * local_bc8->jstride
                                      + (long)(local_d24 - (local_bc8->begin).z) *
                                        local_bc8->kstride + local_bc8->nstride] * (double)local_a30
                                    + local_bc8->p
                                      [(long)(local_d2c - (local_bc8->begin).x) +
                                       (long)(local_d28 - (local_bc8->begin).y) * local_bc8->jstride
                                       + (long)(local_d24 - (local_bc8->begin).z) *
                                         local_bc8->kstride] * 0.5)) +
                             *(double *)(*(long *)local_b68._144_8_ + lVar8 * 8);
                      }
                    }
                  }
                }
              }
              Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            *)in_stack_fffffffffffff180,(size_type)in_stack_fffffffffffff178);
              pvVar7 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                                 ((array<amrex::LinOpBCType,_3UL> *)in_stack_fffffffffffff180,
                                  (size_type)in_stack_fffffffffffff178);
              if ((*pvVar7 == Robin) && ((local_bb6 & 1) != 0)) {
                if (local_b68._76_4_ == 0) {
                  local_8a0 = local_b98;
                  local_198 = local_b98;
                  local_19c = 0;
                  local_894 = (local_b98->smallend).vect[0];
                  local_1a8 = local_b98;
                  local_1ac = 1;
                  iStack_890 = (local_b98->smallend).vect[1];
                  local_8b0 = *(pointer *)(local_b98->smallend).vect;
                  local_1b8 = local_b98;
                  local_1bc = 2;
                  local_8a8 = (local_b98->smallend).vect[2];
                  local_7b0 = local_b98;
                  local_2b8 = &local_b98->bigend;
                  local_2bc = 0;
                  local_7a4 = local_2b8->vect[0];
                  local_2c8 = &local_b98->bigend;
                  local_2cc = 1;
                  iStack_7a0 = (local_b98->bigend).vect[1];
                  local_7c0 = *(undefined8 *)local_2b8->vect;
                  local_2d8 = &local_b98->bigend;
                  local_2dc = 2;
                  local_7b8 = (local_b98->bigend).vect[2];
                  for (local_d84 = local_8a8; local_d88 = iStack_890, local_88c = local_8a8,
                      local_79c = local_7b8, local_d84 <= local_7b8; local_d84 = local_d84 + 1) {
                    for (; local_d8c = local_894, local_d88 <= iStack_7a0; local_d88 = local_d88 + 1
                        ) {
                      for (; local_d8c <= local_7a4; local_d8c = local_d8c + 1) {
                        local_5c0 = local_bc8;
                        local_5c4 = local_d8c;
                        local_5c8 = local_d88;
                        local_5cc = local_d84;
                        local_5d0 = 1;
                        local_5d8 = local_bc8;
                        local_5dc = local_d8c;
                        local_5e0 = local_d88;
                        local_5e4 = local_d84;
                        local_5e8 = 0;
                        local_5f0 = local_bc8;
                        local_5f4 = local_d8c;
                        local_5f8 = local_d88;
                        local_5fc = local_d84;
                        local_600 = 1;
                        local_608 = local_bc8;
                        local_60c = local_d8c;
                        local_610 = local_d88;
                        local_614 = local_d84;
                        local_618 = 0;
                        local_620 = (FabArray<amrex::FArrayBox> *)local_b68._64_8_;
                        local_624 = local_d8c;
                        local_628 = local_d88;
                        local_62c = local_d84;
                        local_630 = local_bbc;
                        local_410 = (long *)local_b68._144_8_;
                        local_414 = local_d8c + -1;
                        local_418 = local_d88;
                        local_41c = local_d84;
                        local_420 = local_bbc;
                        lVar8 = (long)(local_414 - (int)*(long *)(local_b68._144_8_ + 0x20)) +
                                (long)(local_d88 - *(int *)(local_b68._144_8_ + 0x24)) *
                                *(long *)(local_b68._144_8_ + 8) +
                                (long)(local_d84 - (int)*(long *)(local_b68._144_8_ + 0x28)) *
                                *(long *)(local_b68._144_8_ + 0x10) +
                                (long)local_bbc * *(long *)(local_b68._144_8_ + 0x18);
                        *(double *)(*(long *)local_b68._144_8_ + lVar8 * 8) =
                             local_a08 * (double)local_a20 * (double)local_a20 *
                             *(double *)
                              (*(long *)local_b68._64_8_ +
                              ((long)(local_d8c - *(int *)(local_b68._64_8_ + 0x20)) +
                               (long)(local_d88 - *(int *)(local_b68._64_8_ + 0x24)) *
                               (long)*(FabArrayBase **)&((BoxArray *)(local_b68._64_8_ + 8))->m_bat
                               + (long)(local_d84 - *(int *)(local_b68._64_8_ + 0x28)) *
                                 *(long *)((IntVect *)(local_b68._64_8_ + 0x10))->vect +
                              (long)local_bbc * *(long *)(local_b68._64_8_ + 0x18)) * 8) *
                             (1.0 - (local_bc8->p
                                     [(long)(local_d8c - (local_bc8->begin).x) +
                                      (long)(local_d88 - (local_bc8->begin).y) * local_bc8->jstride
                                      + (long)(local_d84 - (local_bc8->begin).z) *
                                        local_bc8->kstride + local_bc8->nstride] * (double)local_a20
                                    + -(local_bc8->p
                                        [(long)(local_d8c - (local_bc8->begin).x) +
                                         (long)(local_d88 - (local_bc8->begin).y) *
                                         local_bc8->jstride +
                                         (long)(local_d84 - (local_bc8->begin).z) *
                                         local_bc8->kstride] * 0.5)) /
                                    (local_bc8->p
                                     [(long)(local_d8c - (local_bc8->begin).x) +
                                      (long)(local_d88 - (local_bc8->begin).y) * local_bc8->jstride
                                      + (long)(local_d84 - (local_bc8->begin).z) *
                                        local_bc8->kstride + local_bc8->nstride] * (double)local_a20
                                    + local_bc8->p
                                      [(long)(local_d8c - (local_bc8->begin).x) +
                                       (long)(local_d88 - (local_bc8->begin).y) * local_bc8->jstride
                                       + (long)(local_d84 - (local_bc8->begin).z) *
                                         local_bc8->kstride] * 0.5)) +
                             *(double *)(*(long *)local_b68._144_8_ + lVar8 * 8);
                      }
                    }
                  }
                }
                else if (local_b68._76_4_ == 1) {
                  local_8c8 = local_b98;
                  local_168 = local_b98;
                  local_16c = 0;
                  local_8bc = (local_b98->smallend).vect[0];
                  local_178 = local_b98;
                  local_17c = 1;
                  iStack_8b8 = (local_b98->smallend).vect[1];
                  local_8d8 = *(pointer *)(local_b98->smallend).vect;
                  local_188 = local_b98;
                  local_18c = 2;
                  local_8d0 = (local_b98->smallend).vect[2];
                  local_7d8 = local_b98;
                  local_288 = &local_b98->bigend;
                  local_28c = 0;
                  local_7cc = local_288->vect[0];
                  local_298 = &local_b98->bigend;
                  local_29c = 1;
                  iStack_7c8 = (local_b98->bigend).vect[1];
                  local_7e8 = *(undefined8 *)local_288->vect;
                  local_2a8 = &local_b98->bigend;
                  local_2ac = 2;
                  local_7e0 = (local_b98->bigend).vect[2];
                  for (local_de4 = local_8d0; local_de8 = iStack_8b8, local_8b4 = local_8d0,
                      local_7c4 = local_7e0, local_de4 <= local_7e0; local_de4 = local_de4 + 1) {
                    for (; local_dec = local_8bc, local_de8 <= iStack_7c8; local_de8 = local_de8 + 1
                        ) {
                      for (; local_dec <= local_7cc; local_dec = local_dec + 1) {
                        local_638 = local_bc8;
                        local_63c = local_dec;
                        local_640 = local_de8;
                        local_644 = local_de4;
                        local_648 = 1;
                        local_650 = local_bc8;
                        local_654 = local_dec;
                        local_658 = local_de8;
                        local_65c = local_de4;
                        local_660 = 0;
                        local_668 = local_bc8;
                        local_66c = local_dec;
                        local_670 = local_de8;
                        local_674 = local_de4;
                        local_678 = 1;
                        local_680 = local_bc8;
                        local_684 = local_dec;
                        local_688 = local_de8;
                        local_68c = local_de4;
                        local_690 = 0;
                        local_698 = (FabArray<amrex::FArrayBox> *)local_b68._64_8_;
                        local_69c = local_dec;
                        local_6a0 = local_de8;
                        local_6a4 = local_de4;
                        local_6a8 = local_bbc;
                        local_428 = (long *)local_b68._144_8_;
                        local_42c = local_dec;
                        local_430 = local_de8 + -1;
                        local_434 = local_de4;
                        local_438 = local_bbc;
                        lVar8 = (long)(local_dec - (int)*(long *)(local_b68._144_8_ + 0x20)) +
                                (long)(local_430 - *(int *)(local_b68._144_8_ + 0x24)) *
                                *(long *)(local_b68._144_8_ + 8) +
                                (long)(local_de4 - (int)*(long *)(local_b68._144_8_ + 0x28)) *
                                *(long *)(local_b68._144_8_ + 0x10) +
                                (long)local_bbc * *(long *)(local_b68._144_8_ + 0x18);
                        *(double *)(*(long *)local_b68._144_8_ + lVar8 * 8) =
                             local_a08 * (double)local_a28 * (double)local_a28 *
                             *(double *)
                              (*(long *)local_b68._64_8_ +
                              ((long)(local_dec - *(int *)(local_b68._64_8_ + 0x20)) +
                               (long)(local_de8 - *(int *)(local_b68._64_8_ + 0x24)) *
                               (long)*(FabArrayBase **)&((BoxArray *)(local_b68._64_8_ + 8))->m_bat
                               + (long)(local_de4 - *(int *)(local_b68._64_8_ + 0x28)) *
                                 *(long *)((IntVect *)(local_b68._64_8_ + 0x10))->vect +
                              (long)local_bbc * *(long *)(local_b68._64_8_ + 0x18)) * 8) *
                             (1.0 - (local_bc8->p
                                     [(long)(local_dec - (local_bc8->begin).x) +
                                      (long)(local_de8 - (local_bc8->begin).y) * local_bc8->jstride
                                      + (long)(local_de4 - (local_bc8->begin).z) *
                                        local_bc8->kstride + local_bc8->nstride] * (double)local_a28
                                    + -(local_bc8->p
                                        [(long)(local_dec - (local_bc8->begin).x) +
                                         (long)(local_de8 - (local_bc8->begin).y) *
                                         local_bc8->jstride +
                                         (long)(local_de4 - (local_bc8->begin).z) *
                                         local_bc8->kstride] * 0.5)) /
                                    (local_bc8->p
                                     [(long)(local_dec - (local_bc8->begin).x) +
                                      (long)(local_de8 - (local_bc8->begin).y) * local_bc8->jstride
                                      + (long)(local_de4 - (local_bc8->begin).z) *
                                        local_bc8->kstride + local_bc8->nstride] * (double)local_a28
                                    + local_bc8->p
                                      [(long)(local_dec - (local_bc8->begin).x) +
                                       (long)(local_de8 - (local_bc8->begin).y) * local_bc8->jstride
                                       + (long)(local_de4 - (local_bc8->begin).z) *
                                         local_bc8->kstride] * 0.5)) +
                             *(double *)(*(long *)local_b68._144_8_ + lVar8 * 8);
                      }
                    }
                  }
                }
                else {
                  local_8f0 = local_b98;
                  local_138 = local_b98;
                  local_13c = 0;
                  local_8e4 = (local_b98->smallend).vect[0];
                  local_148 = local_b98;
                  local_14c = 1;
                  iStack_8e0 = (local_b98->smallend).vect[1];
                  local_900 = *(pointer *)(local_b98->smallend).vect;
                  local_158 = local_b98;
                  local_15c = 2;
                  local_8f8 = (local_b98->smallend).vect[2];
                  local_800 = local_b98;
                  local_258 = &local_b98->bigend;
                  local_25c = 0;
                  local_7f4 = local_258->vect[0];
                  local_268 = &local_b98->bigend;
                  local_26c = 1;
                  iStack_7f0 = (local_b98->bigend).vect[1];
                  local_810 = *(Real *)local_258->vect;
                  local_278 = &local_b98->bigend;
                  local_27c = 2;
                  local_808 = (local_b98->bigend).vect[2];
                  for (local_e44 = local_8f8; local_e48 = iStack_8e0, local_8dc = local_8f8,
                      local_7ec = local_808, local_e44 <= local_808; local_e44 = local_e44 + 1) {
                    for (; iVar4 = local_8e4, local_e48 <= iStack_7f0; local_e48 = local_e48 + 1) {
                      while (in_stack_fffffffffffff1b4 = iVar4,
                            in_stack_fffffffffffff1b4 <= local_7f4) {
                        local_6b0 = local_bc8;
                        local_6b8 = local_e48;
                        local_6bc = local_e44;
                        local_6c0 = 1;
                        local_6c8 = local_bc8;
                        local_6d0 = local_e48;
                        local_6d4 = local_e44;
                        local_6d8 = 0;
                        local_6e0 = local_bc8;
                        local_6e8 = local_e48;
                        local_6ec = local_e44;
                        local_6f0 = 1;
                        local_6f8 = local_bc8;
                        local_700 = local_e48;
                        local_704 = local_e44;
                        local_708 = 0;
                        in_stack_fffffffffffff1a8 =
                             (FabArrayBase *)
                             ((local_bc8->p
                               [(long)(in_stack_fffffffffffff1b4 - (local_bc8->begin).x) +
                                (long)(local_e48 - (local_bc8->begin).y) * local_bc8->jstride +
                                (long)(local_e44 - (local_bc8->begin).z) * local_bc8->kstride +
                                local_bc8->nstride] * (double)local_a30 +
                              -(local_bc8->p
                                [(long)(in_stack_fffffffffffff1b4 - (local_bc8->begin).x) +
                                 (long)(local_e48 - (local_bc8->begin).y) * local_bc8->jstride +
                                 (long)(local_e44 - (local_bc8->begin).z) * local_bc8->kstride] *
                               0.5)) / (local_bc8->p
                                        [(long)(in_stack_fffffffffffff1b4 - (local_bc8->begin).x) +
                                         (long)(local_e48 - (local_bc8->begin).y) *
                                         local_bc8->jstride +
                                         (long)(local_e44 - (local_bc8->begin).z) *
                                         local_bc8->kstride + local_bc8->nstride] *
                                        (double)local_a30 +
                                       local_bc8->p
                                       [(long)(in_stack_fffffffffffff1b4 - (local_bc8->begin).x) +
                                        (long)(local_e48 - (local_bc8->begin).y) *
                                        local_bc8->jstride +
                                        (long)(local_e44 - (local_bc8->begin).z) *
                                        local_bc8->kstride] * 0.5));
                        local_710 = (FabArray<amrex::FArrayBox> *)local_b68._64_8_;
                        local_718 = local_e48;
                        local_71c = local_e44;
                        local_720 = local_bbc;
                        local_440 = (long *)local_b68._144_8_;
                        local_448 = local_e48;
                        local_44c = local_e44 + -1;
                        local_450 = local_bbc;
                        lVar8 = (long)(in_stack_fffffffffffff1b4 -
                                      (int)*(long *)(local_b68._144_8_ + 0x20)) +
                                (long)(local_e48 - *(int *)(local_b68._144_8_ + 0x24)) *
                                *(long *)(local_b68._144_8_ + 8) +
                                (long)(local_44c - (int)*(long *)(local_b68._144_8_ + 0x28)) *
                                *(long *)(local_b68._144_8_ + 0x10) +
                                (long)local_bbc * *(long *)(local_b68._144_8_ + 0x18);
                        *(double *)(*(long *)local_b68._144_8_ + lVar8 * 8) =
                             local_a08 * (double)local_a30 * (double)local_a30 *
                             *(double *)
                              (*(long *)local_b68._64_8_ +
                              ((long)(in_stack_fffffffffffff1b4 - *(int *)(local_b68._64_8_ + 0x20))
                               + (long)(local_e48 - *(int *)(local_b68._64_8_ + 0x24)) *
                                 (long)*(FabArrayBase **)
                                        &((BoxArray *)(local_b68._64_8_ + 8))->m_bat +
                               (long)(local_e44 - *(int *)(local_b68._64_8_ + 0x28)) *
                               *(long *)((IntVect *)(local_b68._64_8_ + 0x10))->vect +
                              (long)local_bbc * *(long *)(local_b68._64_8_ + 0x18)) * 8) *
                             (1.0 - (double)in_stack_fffffffffffff1a8) +
                             *(double *)(*(long *)local_b68._144_8_ + lVar8 * 8);
                        local_714 = in_stack_fffffffffffff1b4;
                        local_6fc = in_stack_fffffffffffff1b4;
                        local_6e4 = in_stack_fffffffffffff1b4;
                        local_6cc = in_stack_fffffffffffff1b4;
                        local_6b4 = in_stack_fffffffffffff1b4;
                        local_444 = in_stack_fffffffffffff1b4;
                        iVar4 = in_stack_fffffffffffff1b4 + 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        MFIter::operator++(&local_aa8);
      }
      MFIter::~MFIter((MFIter *)in_stack_fffffffffffff180);
    }
  }
  return;
}

Assistant:

void
MLABecLaplacian::applyRobinBCTermsCoeffs ()
{
    if (!hasRobinBC()) return;

    const int ncomp = getNComp();
    bool reset_alpha = false;
    if (m_a_scalar == Real(0.0)) {
        m_a_scalar = Real(1.0);
        reset_alpha = true;
    }
    const Real bovera = m_b_scalar/m_a_scalar;

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        const int mglev = 0;
        const Box& domain = m_geom[amrlev][mglev].Domain();
        const Real dxi = m_geom[amrlev][mglev].InvCellSize(0);
        const Real dyi = (AMREX_SPACEDIM >= 2) ? m_geom[amrlev][mglev].InvCellSize(1) : Real(1.0);
        const Real dzi = (AMREX_SPACEDIM == 3) ? m_geom[amrlev][mglev].InvCellSize(2) : Real(1.0);

        if (reset_alpha) {
            m_a_coeffs[amrlev][mglev].setVal(0.0);
        }

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(m_a_coeffs[amrlev][mglev], mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& vbx = mfi.validbox();
            Array4<Real> const& afab = m_a_coeffs[amrlev][mglev].array(mfi);
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                Array4<Real const> const& bfab = m_b_coeffs[amrlev][mglev][idim].const_array(mfi);
                const Box& blo = amrex::adjCellLo(vbx,idim);
                const Box& bhi = amrex::adjCellHi(vbx,idim);
                bool outside_domain_lo = !(domain.contains(blo));
                bool outside_domain_hi = !(domain.contains(bhi));
                if ((!outside_domain_lo) && (!outside_domain_hi)) continue;
                for (int icomp = 0; icomp < ncomp; ++icomp) {
                    Array4<Real const> const& rbc = (*m_robin_bcval[amrlev])[mfi].const_array(icomp*3);
                    if (m_lobc_orig[icomp][idim] == LinOpBCType::Robin && outside_domain_lo)
                    {
                        if (idim == 0) {
                            Real fac = bovera*dxi*dxi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dxi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dxi + rbc(i,j,k,0)*Real(0.5));
                                afab(i+1,j,k,icomp) += fac*bfab(i+1,j,k,icomp)*(Real(1.0)-B);
                            });
                        } else if (idim == 1) {
                            Real fac = bovera*dyi*dyi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dyi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dyi + rbc(i,j,k,0)*Real(0.5));
                                afab(i,j+1,k,icomp) += fac*bfab(i,j+1,k,icomp)*(Real(1.0)-B);
                            });
                        } else {
                            Real fac = bovera*dzi*dzi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dzi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dzi + rbc(i,j,k,0)*Real(0.5));
                                afab(i,j,k+1,icomp) += fac*bfab(i,j,k+1,icomp)*(Real(1.0)-B);
                            });
                        }
                    }
                    if (m_hibc_orig[icomp][idim] == LinOpBCType::Robin && outside_domain_hi)
                    {
                        if (idim == 0) {
                            Real fac = bovera*dxi*dxi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dxi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dxi + rbc(i,j,k,0)*Real(0.5));
                                afab(i-1,j,k,icomp) += fac*bfab(i,j,k,icomp)*(Real(1.0)-B);
                            });
                        } else if (idim == 1) {
                            Real fac = bovera*dyi*dyi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dyi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dyi + rbc(i,j,k,0)*Real(0.5));
                                afab(i,j-1,k,icomp) += fac*bfab(i,j,k,icomp)*(Real(1.0)-B);
                            });
                        } else {
                            Real fac = bovera*dzi*dzi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dzi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dzi + rbc(i,j,k,0)*Real(0.5));
                                afab(i,j,k-1,icomp) += fac*bfab(i,j,k,icomp)*(Real(1.0)-B);
                            });
                        }
                    }
                }
            }
        }
    }
}